

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O0

reference __thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
floor_function::evaluate
          (floor_function *this,
          vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          *args,eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                *context,error_code *ec)

{
  bool bVar1;
  json_type jVar2;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *this_00
  ;
  unsigned_long *puVar3;
  undefined8 uVar4;
  const_reference pvVar5;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_RDX;
  vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  *in_RSI;
  function_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *in_RDI
  ;
  type_conflict1 __x;
  reference arg0;
  string *in_stack_ffffffffffffff38;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  char *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  reference local_8;
  
  this_00 = (eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
             *)std::
               vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
               ::size(in_RSI);
  function_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::arity
            (in_RDI);
  puVar3 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)0x4d6cec);
  if (this_00 ==
      (eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *)
      *puVar3) {
    pvVar5 = std::
             vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
             ::operator[](in_RSI,0);
    bVar1 = parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
            is_value(pvVar5);
    if (bVar1) {
      pvVar5 = std::
               vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
               ::operator[](in_RSI,0);
      parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::value
                (pvVar5);
      jVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::type
                        (in_stack_ffffffffffffff48);
      if ((byte)(jVar2 - int64_value) < 2) {
        basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as<double>
                  (in_stack_ffffffffffffff40);
        local_8 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  ::create_json<double>(this_00,(double *)in_RDI);
      }
      else if (jVar2 == double_value) {
        __x = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as<double>(in_RDX);
        floor(__x);
        local_8 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  ::create_json<double>(this_00,(double *)in_RDI);
      }
      else {
        std::error_code::operator=
                  ((error_code *)CONCAT17(jVar2,in_stack_ffffffffffffff50),
                   (jmespath_errc)((ulong)in_stack_ffffffffffffff48 >> 0x20));
        local_8 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  ::null_value((eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                                *)CONCAT17(jVar2,in_stack_ffffffffffffff50));
      }
    }
    else {
      std::error_code::operator=
                ((error_code *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                 (jmespath_errc)((ulong)in_stack_ffffffffffffff48 >> 0x20));
      local_8 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                ::null_value((eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                              *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
    }
    return local_8;
  }
  uVar4 = __cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(allocator<char> *)this_00);
  assertion_error::assertion_error
            ((assertion_error *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  __cxa_throw(uVar4,&assertion_error::typeinfo,assertion_error::~assertion_error);
}

Assistant:

reference evaluate(const std::vector<parameter_type>& args, eval_context<Json>& context, std::error_code& ec) const override
            {
                JSONCONS_ASSERT(args.size() == *this->arity());

                if (!args[0].is_value())
                {
                    ec = jmespath_errc::invalid_type;
                    return context.null_value();
                }

                reference arg0 = args[0].value();
                switch (arg0.type())
                {
                    case json_type::uint64_value:
                    case json_type::int64_value:
                    {
                        return *context.create_json(arg0.template as<double>());
                    }
                    case json_type::double_value:
                    {
                        return *context.create_json(std::floor(arg0.template as<double>()));
                    }
                    default:
                        ec = jmespath_errc::invalid_type;
                        return context.null_value();
                }
            }